

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_invis(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  char *txt;
  char arg [4608];
  char local_1218 [4608];
  
  one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    if (ch->invis_level == 0) {
      act("$n cloaks $s presence.",ch,(void *)0x0,(void *)0x0,0);
      send_to_char("You cloak your presence.\n\r",ch);
      iVar1 = get_trust(ch);
      ch->invis_level = (short)iVar1;
      return;
    }
    ch->invis_level = 0;
    act("$n uncloaks $s presence.",ch,(void *)0x0,(void *)0x0,0);
    txt = "You uncloak your presence.\n\r";
  }
  else {
    iVar1 = atoi(local_1218);
    if ((1 < iVar1) && (iVar2 = get_trust(ch), iVar1 <= iVar2)) {
      ch->reply = (CHAR_DATA *)0x0;
      act("$n cloaks $s presence.",ch,(void *)0x0,(void *)0x0,0);
      send_to_char("You cloak your presence.\n\r",ch);
      ch->invis_level = (short)iVar1;
      return;
    }
    txt = "Invis level must be between 2 and your level.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_invis(CHAR_DATA *ch, char *argument)
{
	int level;
	char arg[MAX_STRING_LENGTH];

	/* RT code for taking a level argument */
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		/* take the default path */

		if (ch->invis_level)
		{
			ch->invis_level = 0;
			act("$n uncloaks $s presence.", ch, nullptr, nullptr, TO_ROOM);
			send_to_char("You uncloak your presence.\n\r", ch);
		}
		else
		{
			act("$n cloaks $s presence.", ch, nullptr, nullptr, TO_ROOM);
			send_to_char("You cloak your presence.\n\r", ch);

			ch->invis_level = get_trust(ch);
		}
	}
	else
	{
		/* do the level thing */

		level = atoi(arg);
		
		if (level < 2 || level > get_trust(ch))
		{
			send_to_char("Invis level must be between 2 and your level.\n\r", ch);
			return;
		}
		else
		{
			ch->reply = nullptr;

			act("$n cloaks $s presence.", ch, nullptr, nullptr, TO_ROOM);
			send_to_char("You cloak your presence.\n\r", ch);

			ch->invis_level = level;
		}
	}
}